

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteU32Leb128WithReloc
          (BinaryWriter *this,Index index,char *desc,RelocType reloc_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 *puVar2;
  Index IVar3;
  pointer pRVar4;
  pointer pRVar5;
  pointer pRVar6;
  char *pcVar7;
  pointer pRVar8;
  pointer pRVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  ulong uVar12;
  pointer pSVar13;
  long lVar14;
  size_t __n;
  pointer pRVar15;
  ulong uVar16;
  pointer __src;
  mapped_type mVar17;
  ulong uVar18;
  size_t offset;
  SymbolType local_78;
  RelocType local_64;
  pointer local_60;
  unsigned_long local_58;
  key_type local_50;
  
  if (this->options_->relocatable != true) {
    WriteU32Leb128(this->stream_,index,desc);
    return;
  }
  local_64 = reloc_type;
  if ((this->current_reloc_section_ == (RelocSection *)0x0) ||
     (this->current_reloc_section_->section_index != this->section_count_)) {
    pcVar7 = GetSectionName(this->last_section_type_);
    pRVar4 = (this->reloc_sections_).
             super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar4 == (this->reloc_sections_).
                  super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pRVar5 = (this->reloc_sections_).
               super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar14 = (long)pRVar4 - (long)pRVar5;
      if (lVar14 == 0x7ffffffffffffff8) goto LAB_00179bf8;
      uVar18 = (lVar14 >> 3) * -0x3333333333333333;
      uVar12 = 1;
      if (pRVar4 != pRVar5) {
        uVar12 = uVar18;
      }
      uVar16 = uVar12 + uVar18;
      if (0x333333333333332 < uVar16) {
        uVar16 = 0x333333333333333;
      }
      if (CARRY8(uVar12,uVar18)) {
        uVar16 = 0x333333333333333;
      }
      pRVar8 = (pointer)operator_new(uVar16 * 0x28);
      IVar3 = this->section_count_;
      *(char **)((long)pRVar8 + lVar14) = pcVar7;
      *(Index *)((long)pRVar8 + lVar14 + 8) = IVar3;
      puVar2 = (undefined8 *)((long)pRVar8 + lVar14 + 0x10);
      *puVar2 = 0;
      puVar2[1] = 0;
      *(undefined8 *)((long)pRVar8 + lVar14 + 0x20) = 0;
      pRVar15 = pRVar8;
      for (pRVar9 = pRVar5; pRVar4 != pRVar9; pRVar9 = pRVar9 + 1) {
        pRVar15->section_index = pRVar9->section_index;
        pRVar15->name = pRVar9->name;
        pRVar6 = (pRVar9->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (pRVar15->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl
        .super__Vector_impl_data._M_start =
             (pRVar9->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
             _M_impl.super__Vector_impl_data._M_start;
        (pRVar15->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl
        .super__Vector_impl_data._M_finish = pRVar6;
        (pRVar15->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage =
             (pRVar9->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        (pRVar9->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pRVar9->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pRVar9->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pRVar15 = pRVar15 + 1;
      }
      if (pRVar5 != (pointer)0x0) {
        operator_delete(pRVar5);
      }
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_start = pRVar8;
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar15 + 1;
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pRVar8 + uVar16;
    }
    else {
      IVar3 = this->section_count_;
      pRVar4->name = pcVar7;
      pRVar4->section_index = IVar3;
      (pRVar4->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pRVar4->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pRVar4->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pRVar15 = (this->reloc_sections_).
                super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar15 + 1;
    }
    this->current_reloc_section_ = pRVar15;
  }
  local_58 = this->stream_->offset_ - this->last_section_payload_offset_;
  paVar1 = &local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar1;
  if (reloc_type == First) {
    local_78 = Function;
  }
  else {
    if (reloc_type != GlobalIndexLEB) {
      _GLOBAL__N_1::BinaryWriter::WriteU32Leb128WithReloc((BinaryWriter *)(ulong)reloc_type);
      mVar17 = 0xffffffff;
      goto LAB_00179b9b;
    }
    local_78 = Global;
  }
  std::__cxx11::string::_M_assign((string *)&local_50);
  iVar10 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&(this->symtab_)._M_h,&local_50);
  if (iVar10.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    mVar17 = (int)((ulong)((long)(this->symbols_).
                                 super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->symbols_).
                                super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
    pmVar11 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->symtab_,&local_50);
    *pmVar11 = mVar17;
    pSVar13 = (this->symbols_).
              super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar13 ==
        (this->symbols_).
        super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      __src = (this->symbols_).
              super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
      __n = (long)pSVar13 - (long)__src;
      if (__n == 0x7ffffffffffffff8) {
LAB_00179bf8:
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      lVar14 = (long)__n >> 2;
      uVar18 = lVar14 * -0x5555555555555555;
      uVar12 = 1;
      if (pSVar13 != __src) {
        uVar12 = uVar18;
      }
      uVar16 = uVar12 + uVar18;
      if (0xaaaaaaaaaaaaaa9 < uVar16) {
        uVar16 = 0xaaaaaaaaaaaaaaa;
      }
      if (CARRY8(uVar12,uVar18)) {
        uVar16 = 0xaaaaaaaaaaaaaaa;
      }
      if (uVar16 == 0) {
        pSVar13 = (pointer)0x0;
      }
      else {
        local_60 = __src;
        pSVar13 = (pointer)operator_new(uVar16 * 0xc);
        __src = local_60;
      }
      (&pSVar13->symbol_index)[lVar14] = mVar17;
      (&pSVar13->type)[lVar14] = local_78;
      (&pSVar13->element_index)[lVar14] = index;
      if (0 < (long)__n) {
        memmove(pSVar13,__src,__n);
      }
      if (__src != (pointer)0x0) {
        operator_delete(__src);
      }
      (this->symbols_).
      super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_start = pSVar13;
      (this->symbols_).
      super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)pSVar13 + __n + 0xc);
      (this->symbols_).
      super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar13 + uVar16;
    }
    else {
      pSVar13->symbol_index = mVar17;
      pSVar13->type = local_78;
      pSVar13->element_index = index;
      (this->symbols_).
      super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_finish = pSVar13 + 1;
    }
  }
  else {
    mVar17 = *(mapped_type *)
              ((long)iVar10.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                     ._M_cur + 0x28);
  }
LAB_00179b9b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_50._M_dataplus._M_p._0_4_ = mVar17;
  std::vector<wabt::Reloc,std::allocator<wabt::Reloc>>::
  emplace_back<wabt::RelocType&,unsigned_long&,unsigned_int&>
            ((vector<wabt::Reloc,std::allocator<wabt::Reloc>> *)
             &this->current_reloc_section_->relocations,&local_64,&local_58,(uint *)&local_50);
  WriteFixedU32Leb128(this->stream_,index,desc);
  return;
}

Assistant:

void BinaryWriter::WriteU32Leb128WithReloc(Index index,
                                           const char* desc,
                                           RelocType reloc_type) {
  if (options_.relocatable) {
    AddReloc(reloc_type, index);
    WriteFixedU32Leb128(stream_, index, desc);
  } else {
    WriteU32Leb128(stream_, index, desc);
  }
}